

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O0

void anon_unknown.dwarf_3d9ed0::updateXMeshVertices<aiMesh>
               (aiMesh *pMesh,
               vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *uniqueVertices)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  bool bVar8;
  size_type sVar9;
  ulong uVar10;
  ulong uVar11;
  aiVector3D *paVar12;
  reference pvVar13;
  aiColor4D *paVar14;
  aiColor4D *paVar15;
  aiVector3D *paVar16;
  aiVector3t<float> *local_148;
  aiColor4t<float> *local_118;
  aiVector3t<float> *local_e8;
  aiVector3t<float> *local_b8;
  aiVector3t<float> *local_88;
  aiVector3t<float> *local_58;
  uint local_38;
  uint local_34;
  uint b_1;
  uint a_5;
  uint b;
  uint a_4;
  uint a_3;
  uint a_2;
  uint a_1;
  uint a;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *uniqueVertices_local;
  aiMesh *pMesh_local;
  
  sVar9 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::size(uniqueVertices);
  pMesh->mNumVertices = (uint)sVar9;
  if (pMesh->mVertices != (aiVector3D *)0x0) {
    if (pMesh->mVertices != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mVertices);
    }
    uVar10 = CONCAT44(0,pMesh->mNumVertices);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    uVar11 = SUB168(auVar1 * ZEXT816(0xc),0);
    if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    paVar12 = (aiVector3D *)operator_new__(uVar11);
    if (uVar10 != 0) {
      local_58 = paVar12;
      do {
        aiVector3t<float>::aiVector3t(local_58);
        local_58 = local_58 + 1;
      } while (local_58 != paVar12 + uVar10);
    }
    pMesh->mVertices = paVar12;
    for (a_2 = 0; a_2 < pMesh->mNumVertices; a_2 = a_2 + 1) {
      pvVar13 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                          (uniqueVertices,(ulong)a_2);
      paVar12 = pMesh->mVertices + a_2;
      fVar7 = (pvVar13->position).y;
      paVar12->x = (pvVar13->position).x;
      paVar12->y = fVar7;
      paVar12->z = (pvVar13->position).z;
    }
  }
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if (pMesh->mNormals != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mNormals);
    }
    uVar10 = CONCAT44(0,pMesh->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    uVar11 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    paVar12 = (aiVector3D *)operator_new__(uVar11);
    if (uVar10 != 0) {
      local_88 = paVar12;
      do {
        aiVector3t<float>::aiVector3t(local_88);
        local_88 = local_88 + 1;
      } while (local_88 != paVar12 + uVar10);
    }
    pMesh->mNormals = paVar12;
    for (a_3 = 0; a_3 < pMesh->mNumVertices; a_3 = a_3 + 1) {
      pvVar13 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                          (uniqueVertices,(ulong)a_3);
      paVar12 = pMesh->mNormals + a_3;
      fVar7 = (pvVar13->normal).y;
      paVar12->x = (pvVar13->normal).x;
      paVar12->y = fVar7;
      paVar12->z = (pvVar13->normal).z;
    }
  }
  if (pMesh->mTangents != (aiVector3D *)0x0) {
    if (pMesh->mTangents != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mTangents);
    }
    uVar10 = CONCAT44(0,pMesh->mNumVertices);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    uVar11 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    paVar12 = (aiVector3D *)operator_new__(uVar11);
    if (uVar10 != 0) {
      local_b8 = paVar12;
      do {
        aiVector3t<float>::aiVector3t(local_b8);
        local_b8 = local_b8 + 1;
      } while (local_b8 != paVar12 + uVar10);
    }
    pMesh->mTangents = paVar12;
    for (a_4 = 0; a_4 < pMesh->mNumVertices; a_4 = a_4 + 1) {
      pvVar13 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                          (uniqueVertices,(ulong)a_4);
      paVar12 = pMesh->mTangents + a_4;
      fVar7 = (pvVar13->tangent).y;
      paVar12->x = (pvVar13->tangent).x;
      paVar12->y = fVar7;
      paVar12->z = (pvVar13->tangent).z;
    }
  }
  if (pMesh->mBitangents != (aiVector3D *)0x0) {
    if (pMesh->mBitangents != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mBitangents);
    }
    uVar10 = CONCAT44(0,pMesh->mNumVertices);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar10;
    uVar11 = SUB168(auVar4 * ZEXT816(0xc),0);
    if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    paVar12 = (aiVector3D *)operator_new__(uVar11);
    if (uVar10 != 0) {
      local_e8 = paVar12;
      do {
        aiVector3t<float>::aiVector3t(local_e8);
        local_e8 = local_e8 + 1;
      } while (local_e8 != paVar12 + uVar10);
    }
    pMesh->mBitangents = paVar12;
    for (b = 0; b < pMesh->mNumVertices; b = b + 1) {
      pvVar13 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                          (uniqueVertices,(ulong)b);
      paVar12 = pMesh->mBitangents + b;
      fVar7 = (pvVar13->bitangent).y;
      paVar12->x = (pvVar13->bitangent).x;
      paVar12->y = fVar7;
      paVar12->z = (pvVar13->bitangent).z;
    }
  }
  a_5 = 0;
  while (bVar8 = aiMesh::HasVertexColors(pMesh,a_5), bVar8) {
    if (pMesh->mColors[a_5] != (aiColor4D *)0x0) {
      operator_delete__(pMesh->mColors[a_5]);
    }
    uVar10 = CONCAT44(0,pMesh->mNumVertices);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar10;
    uVar11 = SUB168(auVar5 * ZEXT816(0x10),0);
    if (SUB168(auVar5 * ZEXT816(0x10),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    paVar14 = (aiColor4D *)operator_new__(uVar11);
    if (uVar10 != 0) {
      local_118 = paVar14;
      do {
        aiColor4t<float>::aiColor4t(local_118);
        local_118 = local_118 + 1;
      } while (local_118 != paVar14 + uVar10);
    }
    pMesh->mColors[a_5] = paVar14;
    for (b_1 = 0; b_1 < pMesh->mNumVertices; b_1 = b_1 + 1) {
      pvVar13 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                          (uniqueVertices,(ulong)b_1);
      paVar15 = pvVar13->colors + a_5;
      paVar14 = pMesh->mColors[a_5] + b_1;
      fVar7 = paVar15->g;
      paVar14->r = paVar15->r;
      paVar14->g = fVar7;
      fVar7 = paVar15->a;
      paVar14->b = paVar15->b;
      paVar14->a = fVar7;
    }
    a_5 = a_5 + 1;
  }
  local_34 = 0;
  while (bVar8 = aiMesh::HasTextureCoords(pMesh,local_34), bVar8) {
    if (pMesh->mTextureCoords[local_34] != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mTextureCoords[local_34]);
    }
    uVar10 = CONCAT44(0,pMesh->mNumVertices);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar10;
    uVar11 = SUB168(auVar6 * ZEXT816(0xc),0);
    if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    paVar12 = (aiVector3D *)operator_new__(uVar11);
    if (uVar10 != 0) {
      local_148 = paVar12;
      do {
        aiVector3t<float>::aiVector3t(local_148);
        local_148 = local_148 + 1;
      } while (local_148 != paVar12 + uVar10);
    }
    pMesh->mTextureCoords[local_34] = paVar12;
    for (local_38 = 0; local_38 < pMesh->mNumVertices; local_38 = local_38 + 1) {
      pvVar13 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                          (uniqueVertices,(ulong)local_38);
      paVar16 = pvVar13->texcoords + local_34;
      paVar12 = pMesh->mTextureCoords[local_34] + local_38;
      fVar7 = paVar16->y;
      paVar12->x = paVar16->x;
      paVar12->y = fVar7;
      paVar12->z = paVar16->z;
    }
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void updateXMeshVertices(XMesh *pMesh, std::vector<Vertex> &uniqueVertices) {
    // replace vertex data with the unique data sets
    pMesh->mNumVertices = (unsigned int)uniqueVertices.size();

    // ----------------------------------------------------------------------------
    // NOTE - we're *not* calling Vertex::SortBack() because it would check for
    // presence of every single vertex component once PER VERTEX. And our CPU
    // dislikes branches, even if they're easily predictable.
    // ----------------------------------------------------------------------------

    // Position, if present (check made for aiAnimMesh)
    if (pMesh->mVertices)
    {
        delete [] pMesh->mVertices;
        pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
        for (unsigned int a = 0; a < pMesh->mNumVertices; a++) {
            pMesh->mVertices[a] = uniqueVertices[a].position;
        }
    }

    // Normals, if present
    if (pMesh->mNormals)
    {
        delete [] pMesh->mNormals;
        pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
        for( unsigned int a = 0; a < pMesh->mNumVertices; a++) {
            pMesh->mNormals[a] = uniqueVertices[a].normal;
        }
    }
    // Tangents, if present
    if (pMesh->mTangents)
    {
        delete [] pMesh->mTangents;
        pMesh->mTangents = new aiVector3D[pMesh->mNumVertices];
        for (unsigned int a = 0; a < pMesh->mNumVertices; a++) {
            pMesh->mTangents[a] = uniqueVertices[a].tangent;
        }
    }
    // Bitangents as well
    if (pMesh->mBitangents)
    {
        delete [] pMesh->mBitangents;
        pMesh->mBitangents = new aiVector3D[pMesh->mNumVertices];
        for (unsigned int a = 0; a < pMesh->mNumVertices; a++) {
            pMesh->mBitangents[a] = uniqueVertices[a].bitangent;
        }
    }
    // Vertex colors
    for (unsigned int a = 0; pMesh->HasVertexColors(a); a++)
    {
        delete [] pMesh->mColors[a];
        pMesh->mColors[a] = new aiColor4D[pMesh->mNumVertices];
        for( unsigned int b = 0; b < pMesh->mNumVertices; b++) {
            pMesh->mColors[a][b] = uniqueVertices[b].colors[a];
        }
    }
    // Texture coords
    for (unsigned int a = 0; pMesh->HasTextureCoords(a); a++)
    {
        delete [] pMesh->mTextureCoords[a];
        pMesh->mTextureCoords[a] = new aiVector3D[pMesh->mNumVertices];
        for (unsigned int b = 0; b < pMesh->mNumVertices; b++) {
            pMesh->mTextureCoords[a][b] = uniqueVertices[b].texcoords[a];
        }
    }
}